

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

unsigned_short insn_find(insn_map *insns,uint max,uint id,unsigned_short **cache)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint uVar4;
  
  if (insns[max - 1].id < id) {
    uVar1 = 0;
  }
  else {
    puVar2 = *cache;
    if (puVar2 == (unsigned_short *)0x0) {
      puVar2 = (unsigned_short *)(*cs_mem_malloc)((ulong)insns[max - 1].id * 2 + 2);
      if (1 < max) {
        uVar3 = 2;
        do {
          puVar2[insns[(ushort)(uVar3 - 1)].id] = uVar3 - 1;
          uVar4 = (uint)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar4 < max);
      }
      *cache = puVar2;
    }
    uVar1 = puVar2[id];
  }
  return uVar1;
}

Assistant:

unsigned short insn_find(insn_map *insns, unsigned int max, unsigned int id, unsigned short **cache)
{
	if (id > insns[max - 1].id)
		return 0;

	if (*cache == NULL)
		*cache = make_id2insn(insns, max);

	return (*cache)[id];
}